

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O0

void __thiscall TrivialRETest_Compilations_Test::TestBody(TrivialRETest_Compilations_Test *this)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  __l;
  string_view str;
  bool bVar1;
  reference ppVar2;
  type *this_00;
  size_type sVar3;
  const_pointer pvVar4;
  undefined8 uVar5;
  Message *pMVar6;
  char *message;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  StringTestingBuilder local_231;
  C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> local_230;
  undefined1 local_218 [8];
  string got;
  type *expected;
  type *re;
  char *pcStack_1e0;
  size_t local_1d8;
  char *pcStack_1d0;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  local_1c8;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *__range1;
  allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_199;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_198;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_178;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_158;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_118;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  cases;
  TrivialRETest_Compilations_Test *this_local;
  
  cases.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[58],_true>
            (&local_198,(char (*) [22])"mis.*being deal.*free",
             (char (*) [58])"(seq \'mis\' (star <dot>) \'being deal\' (star <dot>) \'free\')");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[66],_true>
            (&local_178,(char (*) [24])"mis.*(being|deal).*free",
             (char (*) [66])
             "(seq \'mis\' (star <dot>) (alt \'being\' \'deal\') (star <dot>) \'free\')");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[73],_true>
            (&local_158,(char (*) [24])"mis.*(being|deal)*fre*e",
             (char (*) [73])
             "(seq \'mis\' (star <dot>) (star (alt \'being\' \'deal\')) \'fr\' (star \'e\') \'e\')")
  ;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[87],_true>
            (&local_138,(char (*) [24])"mis.*(being|deal)+?free",
             (char (*) [87])
             "(seq \'mis\' (star <dot>) (seq (alt \'being\' \'deal\') (star (alt \'being\' \'deal\'))) \'free\')"
            );
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[72],_true>
            (&local_118,(char (*) [24])"mis.*(being|deal)?fre*e",
             (char (*) [72])
             "(seq \'mis\' (star <dot>) (alt <any> \'being\' \'deal\') \'fr\' (star \'e\') \'e\')");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[72],_true>
            (&local_f8,(char (*) [22])"mis.*being|deal.*free",
             (char (*) [72])
             "(alt (seq \'mis\' (star <dot>) \'being\') (seq \'deal\' (star <dot>) \'free\'))");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[72],_true>
            (&local_d8,(char (*) [23])"mis.*?being|deal.*free",
             (char (*) [72])
             "(alt (seq \'mis\' (star <dot>) \'being\') (seq \'deal\' (star <dot>) \'free\'))");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
            (&local_b8,(char (*) [3])"\\*",(char (*) [4])"\'*\'");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
            (&local_98,(char (*) [3])"\\|",(char (*) [4])"\'|\'");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[18],_true>
            (&local_78,(char (*) [2])0x179ac9,(char (*) [18])"(alt <any> <any>)");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[30],_true>
            (&local_58,(char (*) [5])"(|)|",(char (*) [30])"(alt (alt <any> <any>) <any>)");
  local_30 = 0xb;
  local_38 = &local_198;
  std::
  allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::allocator(&local_199);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)local_28,__l,&local_199);
  std::
  allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~allocator(&local_199);
  printf("--- test cases ---\n");
  __end1 = std::
           vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ::begin((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)local_28);
  local_1c8._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        *)std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::end((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)local_28);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_1c8), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             ::operator*(&__end1);
    re = (type *)(ppVar2->first)._M_len;
    pcStack_1e0 = (ppVar2->first)._M_str;
    local_1d8 = (ppVar2->second)._M_len;
    pcStack_1d0 = (ppVar2->second)._M_str;
    this_00 = std::
              get<0ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                        ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)&re);
    got.field_2._8_8_ =
         std::
         get<1ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                   ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)&re);
    trivialre::re_compiler::C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy>::C
              (&local_230,&local_231);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this_00->_M_len;
    str._M_len = this_00->_M_len;
    str._M_str = this_00->_M_str;
    trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
    CompileOrDie_abi_cxx11_
              ((Matcher *)local_218,
               (C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *)&local_230,str);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
    uVar5 = std::__cxx11::string::c_str();
    printf("test: /%.*s/ -> %s\n",sVar3 & 0xffffffff,pvVar4,uVar5);
    testing::internal::EqHelper::
    Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_258,"expected","got",
               (basic_string_view<char,_std::char_traits<char>_> *)got.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pMVar6 = testing::Message::operator<<(&local_260,(char (*) [5])"re: ");
      pMVar6 = testing::Message::operator<<(pMVar6,this_00);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                 ,0x6e,message);
      testing::internal::AssertHelper::operator=(&local_268,pMVar6);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    std::__cxx11::string::~string((string *)local_218);
    __gnu_cxx::
    __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(TrivialRETest, Compilations) {
  // format is {regex, golden-parsing}
  std::vector<std::pair<std::string_view, std::string_view>> cases = {
      {"mis.*being deal.*free", "(seq 'mis' (star <dot>) 'being deal' (star <dot>) 'free')"},
      {"mis.*(being|deal).*free", "(seq 'mis' (star <dot>) (alt 'being' 'deal') (star <dot>) 'free')"},
      {"mis.*(being|deal)*fre*e", "(seq 'mis' (star <dot>) (star (alt 'being' 'deal')) 'fr' (star 'e') 'e')"},
      {"mis.*(being|deal)+?free", "(seq 'mis' (star <dot>) (seq (alt 'being' 'deal') (star (alt 'being' 'deal'))) 'free')"},
      {"mis.*(being|deal)?fre*e", "(seq 'mis' (star <dot>) (alt <any> 'being' 'deal') 'fr' (star 'e') 'e')"},
      {"mis.*being|deal.*free",
       "(alt (seq 'mis' (star <dot>) 'being') (seq 'deal' (star <dot>) "
       "'free'))"},
      {"mis.*?being|deal.*free", "(alt (seq 'mis' (star <dot>) 'being') (seq 'deal' (star <dot>) 'free'))"},
      {"\\*", "'*'"},
      {"\\|", "'|'"},
      {"|", "(alt <any> <any>)"},
      {"(|)|", "(alt (alt <any> <any>) <any>)"},
  };

  printf("--- test cases ---\n");
  for (auto [re, expected] : cases) {
    std::string got = trivialre::re_compiler::C<StringTestingBuilder>{StringTestingBuilder{}}.CompileOrDie(re);
    printf("test: /%.*s/ -> %s\n", int(re.size()), re.data(), got.c_str());
    EXPECT_EQ(expected, got) << "re: " << re;
  }
}